

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O3

void __thiscall
solitaire::graphics::
SDLGraphicsSystemAfterWindowCreationFailedTests_throwOnLoadTextureIfWindowNotCreated_Test::TestBody
          (SDLGraphicsSystemAfterWindowCreationFailedTests_throwOnLoadTextureIfWindowNotCreated_Test
           *this)

{
  bool bVar1;
  AssertHelper local_60;
  long *local_58;
  char *local_50;
  long local_48 [2];
  GraphicsSystem local_38;
  
  local_48[0] = 0;
  local_48[1] = 0;
  local_50 = (char *)0x0;
  local_58 = local_48;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    SDLGraphicsSystem::loadTexture
              ((SDLGraphicsSystem *)&stack0xffffffffffffffc8,
               (string *)
               &(this->super_SDLGraphicsSystemAfterWindowCreationFailedTests).
                super_SDLGraphicsSystemTests.system);
  }
  std::__cxx11::string::_M_replace((ulong)&local_58,0,local_50,0x28b134);
  testing::Message::Message((Message *)&stack0xffffffffffffffc8);
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0xb8,(char *)local_58);
  testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffffc8);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if (local_38._vptr_GraphicsSystem != (_func_int **)0x0) {
    (**(code **)(*local_38._vptr_GraphicsSystem + 8))();
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemAfterWindowCreationFailedTests,
       throwOnLoadTextureIfWindowNotCreated)
{
    EXPECT_THROW(system.loadTexture(texturePath), std::runtime_error);
}